

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idhash.c
# Opt level: O0

int nni_id_alloc(nni_id_map *m,uint64_t *idp,void *val)

{
  uint64_t id_00;
  uint32_t uVar1;
  size_t sVar2;
  int rv;
  uint64_t id;
  void *val_local;
  uint64_t *idp_local;
  nni_id_map *m_local;
  
  if (val == (void *)0x0) {
    nni_panic("%s: %d: assert err: %s",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/idhash.c",
              0x143,"val != NULL");
  }
  if (m->id_max_val - m->id_min_val < (ulong)m->id_count) {
    m_local._4_4_ = 2;
  }
  else {
    if (m->id_dyn_val == 0) {
      if ((m->id_flags & 2) == 0) {
        m->id_dyn_val = m->id_min_val;
      }
      else {
        uVar1 = nni_random();
        m->id_dyn_val = (ulong)uVar1 % ((m->id_max_val - m->id_min_val) + 1) + m->id_min_val;
      }
    }
    do {
      id_00 = m->id_dyn_val;
      m->id_dyn_val = m->id_dyn_val + 1;
      if (m->id_max_val < m->id_dyn_val) {
        m->id_dyn_val = m->id_min_val;
      }
      sVar2 = id_find(m,id_00);
    } while (sVar2 != 0xffffffffffffffff);
    m_local._4_4_ = nni_id_set(m,id_00,val);
    if (m_local._4_4_ == 0) {
      *idp = id_00;
    }
  }
  return m_local._4_4_;
}

Assistant:

int
nni_id_alloc(nni_id_map *m, uint64_t *idp, void *val)
{
	uint64_t id;
	int      rv;

	NNI_ASSERT(val != NULL);

	// range is inclusive, so > to get +1 effect.
	if (m->id_count > (m->id_max_val - m->id_min_val)) {
		// Really more like ENOSPC.. the table is filled to max.
		return (NNG_ENOMEM);
	}
	if (m->id_dyn_val == 0) {
		if (m->id_flags & NNI_ID_FLAG_RANDOM) {
			// NB: The range is inclusive.
			m->id_dyn_val = nni_random() %
			        (m->id_max_val - m->id_min_val + 1) +
			    m->id_min_val;
		} else {
			m->id_dyn_val = m->id_min_val;
		}
	}

	for (;;) {
		id = m->id_dyn_val;
		m->id_dyn_val++;
		if (m->id_dyn_val > m->id_max_val) {
			m->id_dyn_val = m->id_min_val;
		}

		if (id_find(m, id) == (size_t) -1) {
			break;
		}
	}

	rv = nni_id_set(m, id, val);
	if (rv == 0) {
		*idp = id;
	}
	return (rv);
}